

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O3

void phits2mcpl_parse_args
               (int argc,char **argv,char **infile,char **outfile,char **cfgfile,
               char **dumpsummaryfile,int *double_prec,int *do_gzip)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  char **ppcVar3;
  char *__s2;
  char *pcVar4;
  int iVar5;
  
  *cfgfile = (char *)0x0;
  *dumpsummaryfile = (char *)0x0;
  *infile = (char *)0x0;
  *outfile = (char *)0x0;
  *double_prec = 0;
  *do_gzip = 1;
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar4 = argv[iVar5];
      cVar1 = *pcVar4;
      if (cVar1 != '\0') {
        if (cVar1 == '-') {
          if (((pcVar4[1] == 'h') && (pcVar4[2] == '\0')) ||
             (iVar2 = strcmp(pcVar4,"--help"), iVar2 == 0)) {
LAB_0010306c:
            __ptr = (void *)mcpl_usage_progname(*argv);
            puts("Usage:\n");
            printf("  %s [options] dumpfile [output.mcpl]\n\n",__ptr);
            puts(
                "Converts the Monte Carlo particles in the input dump file (binary PHITS dump\nfile format in suitable configuration) to MCPL format and stores in the\ndesignated output file (defaults to \"output.mcpl\").\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -d, --double : Enable double-precision storage of floating point values.\n  -n, --nogzip : Do not attempt to gzip output file.\n  -c FILE      : Embed entire configuration FILE (the input deck)\n                 used to produce dumpfile in the MCPL header.\n  -s FILE      : Embed into the MCPL header the dump summary text file,\n                 which was produced along with the dumpfile itself."
                );
            free(__ptr);
            exit(0);
          }
          if ((pcVar4[1] == 'c') && (pcVar4[2] == '\0')) {
            if ((iVar5 + 1 == argc) || (pcVar4 = argv[iVar5 + 1], *pcVar4 == '-')) {
              pcVar4 = "Error: Missing argument for -c";
              goto LAB_00103100;
            }
            ppcVar3 = cfgfile;
            if (*cfgfile != (char *)0x0) {
              pcVar4 = "Error: -c specified more than once";
              goto LAB_00103100;
            }
          }
          else {
            if ((pcVar4[1] != 's') || (pcVar4[2] != '\0')) {
              if (pcVar4[1] == 'd') {
                if (pcVar4[2] == '\0') goto LAB_00102fb6;
                iVar2 = strcmp(pcVar4,"--double");
              }
              else {
                iVar2 = strcmp(pcVar4,"--double");
              }
              if (iVar2 != 0) {
                if (((pcVar4[1] != 'n') || (pcVar4[2] != '\0')) &&
                   (iVar2 = strcmp(pcVar4,"--nogzip"), iVar2 != 0)) goto LAB_001030b0;
                goto LAB_00102fa9;
              }
              goto LAB_00102fb6;
            }
            if ((iVar5 + 1 == argc) || (pcVar4 = argv[iVar5 + 1], *pcVar4 == '-')) {
              pcVar4 = "Error: Missing argument for -s";
              goto LAB_00103100;
            }
            ppcVar3 = dumpsummaryfile;
            if (*dumpsummaryfile != (char *)0x0) {
              pcVar4 = "Error: -s specified more than once";
              goto LAB_00103100;
            }
          }
          iVar5 = iVar5 + 1;
          *ppcVar3 = pcVar4;
        }
        else {
          iVar2 = strcmp(pcVar4,"--help");
          if (iVar2 == 0) goto LAB_0010306c;
          iVar2 = strcmp(pcVar4,"--double");
          if (iVar2 == 0) {
LAB_00102fb6:
            *double_prec = 1;
          }
          else {
            iVar2 = strcmp(pcVar4,"--nogzip");
            if (iVar2 == 0) {
LAB_00102fa9:
              *do_gzip = 0;
            }
            else {
              if (cVar1 == '-') {
LAB_001030b0:
                printf("Error: Unknown argument: %s\n",pcVar4);
                goto LAB_00103105;
              }
              if (*infile == (char *)0x0) {
                *infile = pcVar4;
              }
              else {
                if (*outfile != (char *)0x0) {
                  pcVar4 = 
                  "Error: Too many arguments! (run with -h or --help for usage instructions)";
                  goto LAB_00103100;
                }
                *outfile = pcVar4;
              }
            }
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  pcVar4 = *infile;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Error: Too few arguments! (run with -h or --help for usage instructions)";
  }
  else {
    __s2 = *outfile;
    if (__s2 == (char *)0x0) {
      __s2 = "output.mcpl";
      *outfile = "output.mcpl";
      pcVar4 = *infile;
    }
    iVar5 = strcmp(pcVar4,__s2);
    if (iVar5 != 0) {
      return;
    }
    pcVar4 = "Error: input and output files are identical.";
  }
LAB_00103100:
  puts(pcVar4);
LAB_00103105:
  exit(1);
}

Assistant:

void phits2mcpl_parse_args( int argc,char **argv, const char** infile,
                            const char **outfile,  const char **cfgfile,
                            const char **dumpsummaryfile,
                            int* double_prec, int* do_gzip ) {
  *cfgfile = 0;
  *dumpsummaryfile = 0;
  *infile = 0;
  *outfile = 0;
  *double_prec = 0;
  *do_gzip = 1;
  int i;
  for (i=1; i < argc; ++i) {
    if (argv[i][0]=='\0')
      continue;
    if (strcmp(argv[i],"-h")==0||strcmp(argv[i],"--help")==0) {
      char * progname = mcpl_usage_progname(argv[0]);
      printf("Usage:\n\n");
      printf("  %s [options] dumpfile [output.mcpl]\n\n",progname);
      printf("Converts the Monte Carlo particles in the input dump file (binary PHITS dump\n"
             "file format in suitable configuration) to MCPL format and stores in the\n"
             "designated output file (defaults to \"output.mcpl\").\n"
             "\n"
             "Options:\n"
             "\n"
             "  -h, --help   : Show this usage information.\n"
             "  -d, --double : Enable double-precision storage of floating point values.\n"
             "  -n, --nogzip : Do not attempt to gzip output file.\n"
             "  -c FILE      : Embed entire configuration FILE (the input deck)\n"
             "                 used to produce dumpfile in the MCPL header.\n"
             "  -s FILE      : Embed into the MCPL header the dump summary text file,\n"
             "                 which was produced along with the dumpfile itself.\n"
             );
      free(progname);
      exit(0);
    }
    if (strcmp(argv[i],"-c")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -c\n");
        exit(1);
      }
      ++i;
      if (*cfgfile) {
        printf("Error: -c specified more than once\n");
        exit(1);
      }
      *cfgfile = argv[i];
      continue;
    }
    if (strcmp(argv[i],"-s")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -s\n");
        exit(1);
      }
      ++i;
      if (*dumpsummaryfile) {
        printf("Error: -s specified more than once\n");
        exit(1);
      }
      *dumpsummaryfile = argv[i];
      continue;
    }

    if (strcmp(argv[i],"-d")==0||strcmp(argv[i],"--double")==0) {
      *double_prec = 1;
      continue;
    }
    if (strcmp(argv[i],"-n")==0||strcmp(argv[i],"--nogzip")==0) {
      *do_gzip = 0;
      continue;
    }
    if (argv[i][0]=='-') {
      printf("Error: Unknown argument: %s\n",argv[i]);
      exit(1);
    }
    if (!*infile) {
      *infile = argv[i];
      continue;
    }
    if (!*outfile) {
      *outfile = argv[i];
      continue;
    }
    printf("Error: Too many arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*infile) {
    printf("Error: Too few arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*outfile)
    *outfile = "output.mcpl";
  if (strcmp(*infile,*outfile)==0) {
    //basic test, easy to cheat:
    printf("Error: input and output files are identical.\n");
    exit(1);
  }
}